

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLocation.h
# Opt level: O0

void __thiscall flow::FilePos::advance(FilePos *this,char ch)

{
  char ch_local;
  FilePos *this_local;
  
  this->offset = this->offset + 1;
  if (ch == '\n') {
    this->line = this->line + 1;
    this->column = 1;
  }
  else {
    this->column = this->column + 1;
  }
  return;
}

Assistant:

void advance(char ch) {
    offset++;
    if (ch != '\n') {
      column++;
    } else {
      line++;
      column = 1;
    }
  }